

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O3

int drive_compressor(archive_write_filter *f,private_data_conflict7 *data,int finishing)

{
  archive *a;
  size_t sVar1;
  int iVar2;
  lzma_ret lVar3;
  uint64_t uVar4;
  lzma_action action;
  
  do {
    if ((data->stream).avail_out == 0) {
      data->total_out = data->total_out + data->compressed_buffer_size;
      iVar2 = __archive_write_filter(f->next_filter,data->compressed,data->compressed_buffer_size);
      if (iVar2 != 0) {
        return -0x1e;
      }
      sVar1 = data->compressed_buffer_size;
      (data->stream).next_out = data->compressed;
      (data->stream).avail_out = sVar1;
    }
    action = LZMA_FINISH;
    if ((finishing == 0) && (action = LZMA_RUN, (data->stream).avail_in == 0)) {
      return 0;
    }
    lVar3 = lzma_code(&data->stream,action);
    if (lVar3 != LZMA_OK) {
      if (lVar3 == LZMA_STREAM_END) {
        if (finishing != 0) {
          return 0;
        }
        archive_set_error(f->archive,-1,"lzma compression data error");
      }
      else if (lVar3 == LZMA_MEMLIMIT_ERROR) {
        a = f->archive;
        uVar4 = lzma_memusage(&data->stream);
        archive_set_error(a,0xc,"lzma compression error: %ju MiB would have been needed",
                          uVar4 + 0xfffff >> 0x14);
      }
      else {
        archive_set_error(f->archive,-1,
                          "lzma compression failed: lzma_code() call returned status %d",
                          (ulong)lVar3);
      }
      return -0x1e;
    }
  } while ((finishing != 0) || ((data->stream).avail_in != 0));
  return 0;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK) {
				/* TODO: Handle this write failure */
				return (ARCHIVE_FATAL);
			}
			data->stream.next_out = data->compressed;
			data->stream.avail_out = data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = BZ2_bzCompress(&(data->stream),
		    finishing ? BZ_FINISH : BZ_RUN);

		switch (ret) {
		case BZ_RUN_OK:
			/* In non-finishing case, did compressor
			 * consume everything? */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			break;
		case BZ_FINISH_OK:  /* Finishing: There's more work to do */
			break;
		case BZ_STREAM_END: /* Finishing: all done */
			/* Only occurs in finishing case */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error */
			archive_set_error(f->archive,
			    ARCHIVE_ERRNO_PROGRAMMER,
			    "Bzip2 compression failed;"
			    " BZ2_bzCompress() returned %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}